

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void addfield(lua_State *L,luaL_Buffer *b,int i)

{
  int iVar1;
  char *pcVar2;
  uint in_EDX;
  luaL_Buffer *in_RSI;
  lua_State *in_RDI;
  undefined8 in_stack_ffffffffffffffd8;
  lua_State *in_stack_ffffffffffffffe0;
  lua_State *L_00;
  int in_stack_ffffffffffffffe8;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  lua_rawgeti((lua_State *)in_RSI,in_EDX,in_stack_ffffffffffffffe8);
  iVar1 = lua_isstring(in_stack_ffffffffffffffe0,iVar1);
  if (iVar1 == 0) {
    L_00 = in_RDI;
    iVar1 = lua_type((lua_State *)in_RSI,in_EDX);
    pcVar2 = lua_typename(in_RDI,iVar1);
    luaL_error(L_00,"invalid value (%s) at index %d in table for \'concat\'",pcVar2,(ulong)in_EDX);
  }
  luaL_addvalue(in_RSI);
  return;
}

Assistant:

static void addfield(lua_State*L,luaL_Buffer*b,int i){
lua_rawgeti(L,1,i);
if(!lua_isstring(L,-1))
luaL_error(L,"invalid value (%s) at index %d in table for "
LUA_QL("concat"),luaL_typename(L,-1),i);
luaL_addvalue(b);
}